

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O3

void __thiscall
Assimp::X3DImporter::MeshGeometry_AddNormal
          (X3DImporter *this,aiMesh *pMesh,
          list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pNormals,
          bool pNormalPerVertex)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  size_t i;
  aiVector3D *paVar6;
  ulong uVar7;
  ulong uVar8;
  runtime_error *prVar9;
  undefined7 in_register_00000009;
  ulong uVar10;
  _Self __tmp;
  _List_node_base *p_Var11;
  long lVar12;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  p_Var11 = (pNormals->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node.super__List_node_base._M_next;
  sVar3 = (pNormals->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl._M_node._M_size;
  if ((int)CONCAT71(in_register_00000009,pNormalPerVertex) == 0) {
    uVar1 = pMesh->mNumFaces;
    uVar7 = (ulong)uVar1;
    if (sVar3 != uVar7) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"MeshGeometry_AddNormal. Normals and faces count must be equal."
                 ,"");
      std::runtime_error::runtime_error(prVar9,(string *)local_50);
      *(undefined ***)prVar9 = &PTR__runtime_error_008dc448;
      __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar2 = pMesh->mNumVertices;
    uVar8 = (ulong)uVar2 * 0xc;
    paVar6 = (aiVector3D *)operator_new__(uVar8);
    if ((ulong)uVar2 != 0) {
      memset(paVar6,0,((uVar8 - 0xc) / 0xc) * 0xc + 0xc);
    }
    pMesh->mNormals = paVar6;
    if (uVar1 != 0) {
      uVar8 = 0;
      do {
        uVar10 = (ulong)pMesh->mFaces[uVar8].mNumIndices;
        if (uVar10 != 0) {
          uVar7 = 0;
          do {
            paVar6 = pMesh->mNormals;
            uVar1 = pMesh->mFaces[uVar8].mIndices[uVar7];
            paVar6[uVar1].z = *(float *)&p_Var11[1]._M_prev;
            *(_List_node_base **)(paVar6 + uVar1) = p_Var11[1]._M_next;
            uVar7 = uVar7 + 1;
          } while (uVar10 != uVar7);
          uVar7 = (ulong)pMesh->mNumFaces;
        }
        p_Var11 = p_Var11->_M_next;
        uVar8 = uVar8 + 1;
      } while (uVar8 < uVar7);
    }
  }
  else {
    uVar1 = pMesh->mNumVertices;
    if (sVar3 != uVar1) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,
                 "MeshGeometry_AddNormal. Normals and vertices count must be equal.","");
      std::runtime_error::runtime_error(prVar9,(string *)local_50);
      *(undefined ***)prVar9 = &PTR__runtime_error_008dc448;
      __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    paVar6 = (aiVector3D *)operator_new__(sVar3 * 0xc);
    if (uVar1 == 0) {
      pMesh->mNormals = paVar6;
    }
    else {
      lVar12 = 0;
      memset(paVar6,0,((sVar3 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      pMesh->mNormals = paVar6;
      uVar7 = 0;
      do {
        p_Var4 = p_Var11[1]._M_next;
        p_Var5 = p_Var11 + 1;
        p_Var11 = p_Var11->_M_next;
        paVar6 = pMesh->mNormals;
        *(undefined4 *)((long)&paVar6->z + lVar12) = *(undefined4 *)&p_Var5->_M_prev;
        *(_List_node_base **)((long)&paVar6->x + lVar12) = p_Var4;
        uVar7 = uVar7 + 1;
        lVar12 = lVar12 + 0xc;
      } while (uVar7 < pMesh->mNumVertices);
    }
  }
  return;
}

Assistant:

void X3DImporter::MeshGeometry_AddNormal(aiMesh& pMesh, const std::list<aiVector3D>& pNormals, const bool pNormalPerVertex) const
{
    std::list<aiVector3D>::const_iterator norm_it = pNormals.begin();

	if(pNormalPerVertex)
	{
		if(pNormals.size() != pMesh.mNumVertices) throw DeadlyImportError("MeshGeometry_AddNormal. Normals and vertices count must be equal.");

		// copy normals to mesh
		pMesh.mNormals = new aiVector3D[pMesh.mNumVertices];
		for(size_t i = 0; i < pMesh.mNumVertices; i++) pMesh.mNormals[i] = *norm_it++;
	}// if(pNormalPerVertex)
	else
	{
		if(pNormals.size() != pMesh.mNumFaces) throw DeadlyImportError("MeshGeometry_AddNormal. Normals and faces count must be equal.");

		// copy normals to mesh
		pMesh.mNormals = new aiVector3D[pMesh.mNumVertices];
		for(size_t fi = 0; fi < pMesh.mNumFaces; fi++)
		{
			// apply color to all vertices of face
			for(size_t vi = 0, vi_e = pMesh.mFaces[fi].mNumIndices; vi < vi_e; vi++) pMesh.mNormals[pMesh.mFaces[fi].mIndices[vi]] = *norm_it;

			++norm_it;
		}
	}// if(pNormalPerVertex) else
}